

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O0

void write_safe_str(FIOBJ dest,FIOBJ str)

{
  char cVar1;
  bool bVar2;
  fio_str_info_s local_c0;
  size_t local_a8;
  char *writer;
  fio_str_info_s tmp;
  size_t capa;
  size_t added;
  uint64_t end;
  size_t len;
  uint8_t *src;
  size_t local_58;
  char *local_50;
  undefined1 local_48 [8];
  fio_str_info_s t;
  fio_str_info_s s;
  FIOBJ str_local;
  FIOBJ dest_local;
  
  fiobj_obj2cstr((fio_str_info_s *)&t.data,str);
  fiobj_obj2cstr((fio_str_info_s *)local_48,dest);
  *(undefined1 *)(t.len + t.capa) = 0x22;
  t.capa = t.capa + 1;
  fiobj_str_resize(dest,t.capa);
  fiobj_obj2cstr((fio_str_info_s *)&src,dest);
  local_48 = (undefined1  [8])src;
  t.capa = local_58;
  t.len = (size_t)local_50;
  len = s.len;
  end = s.capa;
  added = local_58;
  capa = 0;
  tmp.data = (char *)fiobj_str_capa(dest);
  if (tmp.data <= (char *)(local_58 + s.capa + 0x40)) {
    tmp.data = (char *)fiobj_str_capa_assert(dest,local_58 + s.capa + 0x40);
    fiobj_obj2cstr((fio_str_info_s *)&writer,dest);
    local_48 = (undefined1  [8])writer;
    t.capa = tmp.capa;
    t.len = tmp.len;
  }
  while (end != 0) {
    local_a8 = t.len;
    while( true ) {
      bVar2 = false;
      if (((end != 0) && (bVar2 = false, 0x20 < *(byte *)len)) &&
         (bVar2 = false, *(char *)len != '\"')) {
        bVar2 = *(char *)len != '\\';
      }
      if (!bVar2) break;
      end = end - 1;
      *(undefined1 *)(t.len + added) = *(undefined1 *)len;
      added = added + 1;
      len = len + 1;
    }
    if (end == 0) break;
    cVar1 = *(char *)len;
    if (cVar1 == '\b') {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x62;
      capa = capa + 1;
      added = added + 2;
    }
    else if (cVar1 == '\t') {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x74;
      capa = capa + 1;
      added = added + 2;
    }
    else if (cVar1 == '\n') {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x6e;
      capa = capa + 1;
      added = added + 2;
    }
    else if (cVar1 == '\f') {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x66;
      capa = capa + 1;
      added = added + 2;
    }
    else if (cVar1 == '\r') {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x72;
      capa = capa + 1;
      added = added + 2;
    }
    else if (((cVar1 == '\"') || (cVar1 == '/')) || (cVar1 == '\\')) {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = *(undefined1 *)len;
      capa = capa + 1;
      added = added + 2;
    }
    else if (*(byte *)len < 0x20) {
      *(undefined1 *)(t.len + added) = 0x5c;
      *(undefined1 *)(t.len + added + 1) = 0x75;
      *(undefined1 *)(t.len + added + 2) = 0x30;
      *(undefined1 *)(t.len + added + 3) = 0x30;
      *(char *)(t.len + added + 4) = "0123456789ABCDEF"[(int)(uint)*(byte *)len >> 4];
      *(char *)(t.len + added + 5) = "0123456789ABCDEF"[(int)(*(byte *)len & 0xf)];
      capa = capa + 4;
      added = added + 6;
    }
    else {
      *(undefined1 *)(t.len + added) = *(undefined1 *)len;
      added = added + 1;
    }
    len = len + 1;
    end = end - 1;
    if ((0x2f < capa) && (tmp.data <= (char *)(added + end + 0x40))) {
      *(undefined1 *)(t.len + added) = 0;
      fiobj_str_resize(dest,added);
      fiobj_str_capa_assert(dest,added + end + 0x40);
      fiobj_obj2cstr(&local_c0,dest);
      local_48 = (undefined1  [8])local_c0.capa;
      t.capa = local_c0.len;
      t.len = (size_t)local_c0.data;
      tmp.data = (char *)local_c0.capa;
      capa = 0;
      local_a8 = t.len;
    }
  }
  *(undefined1 *)(t.len + added) = 0x22;
  fiobj_str_resize(dest,added + 1);
  return;
}

Assistant:

static void write_safe_str(FIOBJ dest, const FIOBJ str) {
  fio_str_info_s s = fiobj_obj2cstr(str);
  fio_str_info_s t = fiobj_obj2cstr(dest);
  t.data[t.len] = '"';
  t.len++;
  fiobj_str_resize(dest, t.len);
  t = fiobj_obj2cstr(dest);
  const uint8_t *restrict src = (const uint8_t *)s.data;
  size_t len = s.len;
  uint64_t end = t.len;
  /* make sure we have some room */
  size_t added = 0;
  size_t capa = fiobj_str_capa(dest);
  if (capa <= end + s.len + 64) {
    if (0) {
      capa = (((capa >> 12) + 1) << 12) - 1;
      capa = fiobj_str_capa_assert(dest, capa);
    } else {
      capa = fiobj_str_capa_assert(dest, (end + s.len + 64));
    }
    fio_str_info_s tmp = fiobj_obj2cstr(dest);
    t = tmp;
  }
  while (len) {
    char *restrict writer = (char *)t.data;
    while (len && src[0] > 32 && src[0] != '"' && src[0] != '\\') {
      len--;
      writer[end++] = *(src++);
    }
    if (!len)
      break;
    switch (src[0]) {
    case '\b':
      writer[end++] = '\\';
      writer[end++] = 'b';
      added++;
      break; /* from switch */
    case '\f':
      writer[end++] = '\\';
      writer[end++] = 'f';
      added++;
      break; /* from switch */
    case '\n':
      writer[end++] = '\\';
      writer[end++] = 'n';
      added++;
      break; /* from switch */
    case '\r':
      writer[end++] = '\\';
      writer[end++] = 'r';
      added++;
      break; /* from switch */
    case '\t':
      writer[end++] = '\\';
      writer[end++] = 't';
      added++;
      break; /* from switch */
    case '"':
    case '\\':
    case '/':
      writer[end++] = '\\';
      writer[end++] = src[0];
      added++;
      break; /* from switch */
    default:
      if (src[0] <= 31) {
        /* MUST escape all control values less than 32 */
        writer[end++] = '\\';
        writer[end++] = 'u';
        writer[end++] = '0';
        writer[end++] = '0';
        writer[end++] = hex_chars[src[0] >> 4];
        writer[end++] = hex_chars[src[0] & 15];
        added += 4;
      } else
        writer[end++] = src[0];
      break; /* from switch */
    }
    src++;
    len--;
    if (added >= 48 && capa <= end + len + 64) {
      writer[end] = 0;
      fiobj_str_resize(dest, end);
      fiobj_str_capa_assert(dest, (end + len + 64));
      t = fiobj_obj2cstr(dest);
      writer = (char *)t.data;
      capa = t.capa;
      added = 0;
    }
  }
  t.data[end++] = '"';
  fiobj_str_resize(dest, end);
}